

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::MedianFunction::GetAggregate(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  bool bVar1;
  
  bVar1 = LogicalType::HasAlias(type);
  if (((bVar1) || (0x32 < (ulong)type->id_)) ||
     ((0x60005f0fff802U >> ((ulong)type->id_ & 0x3f) & 1) == 0)) {
    GetDiscreteQuantileTemplated<duckdb::ScalarDiscreteQuantile>(__return_storage_ptr__,type);
  }
  else {
    GetContinuousQuantileTemplated<duckdb::ScalarContinuousQuantile>(__return_storage_ptr__,type);
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name,0,
             (char *)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name._M_string_length,0x1375dc7);
  __return_storage_ptr__->serialize = QuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = Deserialize;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetAggregate(const LogicalType &type) {
		auto fun = CanInterpolate(type) ? GetContinuousQuantile(type) : GetDiscreteQuantile(type);
		fun.name = "median";
		fun.serialize = QuantileBindData::Serialize;
		fun.deserialize = Deserialize;
		return fun;
	}